

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

bool __thiscall TestSkipInternal::Run(TestSkipInternal *this)

{
  Outputter *pOVar1;
  Cons<std::pair<std::pair<testinator::Nil,_const_char_*>,_int>_> *in_RDX;
  string sStack_58;
  testinator local_38 [8];
  char *local_30;
  undefined4 local_28;
  
  pOVar1 = (this->super_Test).m_op;
  local_30 = "Hello world ";
  local_28 = 0x2a;
  testinator::Diagnostic<testinator::Cons<std::pair<std::pair<testinator::Nil,char_const*>,int>>>
            (&sStack_58,local_38,in_RDX);
  (*pOVar1->_vptr_Outputter[1])(pOVar1,&(this->super_Test).m_name,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  (this->super_Test).m_skipped = true;
  return false;
}

Assistant:

virtual bool Run()
  {
    SKIP("Hello world " << 42);
    return false;
  }